

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O2

void anm_extract(anm_archive_t *anm,char *name)

{
  ushort uVar1;
  long *plVar2;
  uchar *__s;
  uchar *__ptr;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  list_node_t *plVar9;
  ulong uVar10;
  image_t image;
  image_t local_48;
  
  local_48.width = 0;
  local_48.height = 0;
  local_48.format = 0xffffffff;
  util_total_entry_size(anm,name,&local_48.width,&local_48.height);
  if (local_48.height != 0 && local_48.width != 0) {
    iVar6 = local_48.width * 4;
    uVar8 = local_48.height * iVar6;
    __s = (uchar *)malloc((ulong)uVar8);
    local_48.data = __s;
    memset(__s,0xff,(ulong)uVar8);
    for (lVar7 = 0; plVar9 = (list_node_t *)&anm->entries, lVar7 != 5; lVar7 = lVar7 + 1) {
      while (plVar9 = plVar9->next, plVar9 != (list_node_t *)0x0) {
        plVar2 = (long *)plVar9->data;
        if ((*(short *)(*plVar2 + 0x34) != 0) && ((char *)plVar2[2] == name)) {
          lVar4 = plVar2[1];
          if ((&DAT_0012b050)[lVar7] == (uint)*(ushort *)(lVar4 + 6)) {
            __ptr = format_to_rgba((uchar *)plVar2[8],
                                   (uint)*(ushort *)(lVar4 + 10) * (uint)*(ushort *)(lVar4 + 8),
                                   (&DAT_0012b050)[lVar7]);
            lVar4 = *plVar2;
            uVar8 = *(uint *)(lVar4 + 0x24);
            uVar3 = (ulong)uVar8;
            iVar5 = uVar8 * 4;
            uVar8 = iVar6 * uVar8;
            uVar10 = uVar3;
            while( true ) {
              if ((uint)*(ushort *)(plVar2[1] + 10) + (int)uVar3 <= uVar10) break;
              uVar1 = *(ushort *)(plVar2[1] + 8);
              memcpy(__s + (ulong)(uint)(*(int *)(lVar4 + 0x20) << 2) + (ulong)uVar8,
                     __ptr + (iVar5 + (int)uVar3 * -4) * (uint)uVar1,(ulong)uVar1 << 2);
              uVar10 = uVar10 + 1;
              lVar4 = *plVar2;
              uVar3 = (ulong)*(uint *)(lVar4 + 0x24);
              iVar5 = iVar5 + 4;
              uVar8 = uVar8 + iVar6;
            }
            free(__ptr);
          }
        }
      }
    }
    util_makepath(name);
    png_write(name,&local_48);
    free(local_48.data);
  }
  return;
}

Assistant:

static void
anm_extract(
    const anm_archive_t* anm,
    const char* name)
{
    const format_t formats[] = {
        FORMAT_GRAY8,
        FORMAT_ARGB4444,
        FORMAT_RGB565,
        FORMAT_BGRA8888,
        FORMAT_RGBA8888
    };
    image_t image;

    unsigned int f, y;

    image.width = 0;
    image.height = 0;
    image.format = FORMAT_RGBA8888;

    util_total_entry_size(anm, name, &image.width, &image.height);

    if (image.width == 0 || image.height == 0) {
        /* Then there's nothing to extract. */
        return;
    }

    image.data = malloc(image.width * image.height * 4);
    /* XXX: Why 0xff? */
    memset(image.data, 0xff, image.width * image.height * 4);

    for (f = 0; f < sizeof(formats) / sizeof(formats[0]); ++f) {
        anm_entry_t* entry;
        list_for_each(&anm->entries, entry) {
            if (entry->header->hasdata && entry->name == name && formats[f] == entry->thtx->format) {
                unsigned char* temp_data = format_to_rgba(entry->data, entry->thtx->w * entry->thtx->h, entry->thtx->format);
                for (y = entry->header->y; y < entry->header->y + entry->thtx->h; ++y) {
                    memcpy(image.data + y * image.width * 4 + entry->header->x * 4,
                           temp_data + (y - entry->header->y) * entry->thtx->w * 4,
                           entry->thtx->w * 4);
                }
                free(temp_data);
            }
        }
    }

    util_makepath(name);
    png_write(name, &image);

    free(image.data);
}